

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RU_matrix.h
# Opt level: O3

void __thiscall
Gudhi::persistence_matrix::
RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>
::_reduce(RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>
          *this)

{
  uint uVar1;
  pointer pIVar2;
  undefined1 *puVar3;
  pointer puVar4;
  pointer pIVar5;
  node_ptr next;
  ulong uVar6;
  anon_class_8_1_8991fb9c get_column_with_pivot_;
  ulong uVar7;
  Column_support *pCVar8;
  anon_class_1_0_00000001 local_3c;
  anon_class_1_0_00000001 local_3b;
  anon_class_1_0_00000001 local_3a;
  anon_class_1_0_00000001 local_39;
  anon_class_8_1_e4bd5e45 local_38;
  
  if ((this->reducedMatrixR_).nextInsertIndex_ != 0) {
    uVar7 = 0;
    do {
      pIVar2 = (this->reducedMatrixR_).matrix_.
               super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pCVar8 = &pIVar2[uVar7].column_;
      puVar3 = *(undefined1 **)&(pCVar8->super_type).data_.root_plus_size_;
      if (((Column_support *)puVar3 != pCVar8 && puVar3 != (undefined1 *)0x0) &&
         ((Column_support *)puVar3 != pCVar8)) {
        while (uVar6 = (ulong)*(uint *)&(*(node_ptr *)
                                          ((long)&pIVar2[uVar7].column_.super_type.data_ + 8))[1].
                                        next_, uVar6 != 0xffffffff) {
          puVar4 = (this->pivotToColumnIndex_).
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar1 = puVar4[uVar6];
          if (uVar1 == 0xffffffff) {
            puVar4[uVar6] = (uint)uVar7;
            break;
          }
          pIVar5 = (this->reducedMatrixR_).matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_38.targetColumn = pIVar5 + uVar7;
          _generic_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,Gudhi::persistence_matrix::_add_to_column<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>,Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,false,false,false,true,false,false>>>>(Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persist___ence_matrix::Column_types)7,false,false,false,true,false,false>>::Matrix_column_tag,1u>,false>___1_>
                    (pIVar5 + uVar1,local_38.targetColumn,&local_39,&local_38,&local_3a,&local_3b,
                     &local_3c);
          pIVar5 = (this->mirrorMatrixU_).matrix_.
                   super__Vector_base<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>,_std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_false,_false,_false,_true,_false,_false>_>_>
          ::push_back(pIVar5 + uVar1,
                      (Entry *)(*(long *)&pIVar5[uVar7].column_.super_type.data_ + -8));
          puVar3 = *(undefined1 **)&(pCVar8->super_type).data_.root_plus_size_;
          if ((puVar3 == (undefined1 *)0x0) || ((Column_support *)puVar3 == pCVar8)) break;
        }
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < (this->reducedMatrixR_).nextInsertIndex_);
  }
  return;
}

Assistant:

inline void RU_matrix<Master_matrix>::_reduce()
{
  if constexpr (Master_matrix::Option_list::has_column_pairings) {
    _indexToBar().reserve(reducedMatrixR_.get_number_of_columns());
  }

  for (Index i = 0; i < reducedMatrixR_.get_number_of_columns(); i++) {
    if (!(reducedMatrixR_.is_zero_column(i))) {
      _reduce_column(i, i);
    } else {
      _add_bar(get_column_dimension(i), i);
    }
  }
}